

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::stringifyBinaryExpr<bool,bool>
          (String *__return_storage_ptr__,detail *this,bool *lhs,char *op,bool *rhs)

{
  byte bVar1;
  char *__dest;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  char *__src;
  anon_union_24_2_13149d16_for_String_2 local_90;
  anon_union_24_2_13149d16_for_String_2 local_78;
  anon_union_24_2_13149d16_for_String_2 local_60;
  anon_union_24_2_13149d16_for_String_2 local_48;
  
  __src = "false";
  pcVar3 = "false";
  if ((ulong)(byte)*this != 0) {
    pcVar3 = "true";
  }
  uVar4 = (ulong)(byte)*this ^ 5;
  __dest = String::allocate((String *)&local_60.data,(uint)uVar4);
  memcpy(__dest,pcVar3,uVar4);
  sVar2 = strlen(lhs);
  pcVar3 = String::allocate((String *)&local_78.data,(uint)sVar2);
  memcpy(pcVar3,lhs,sVar2 & 0xffffffff);
  operator+((String *)&local_48.data,(String *)&local_60.data,(String *)&local_78.data);
  bVar1 = *op;
  uVar4 = (ulong)bVar1 ^ 5;
  pcVar3 = String::allocate((String *)&local_90.data,(uint)uVar4);
  if (bVar1 != 0) {
    __src = "true";
  }
  memcpy(pcVar3,__src,uVar4);
  operator+(__return_storage_ptr__,(String *)&local_48.data,(String *)&local_90.data);
  if ((local_90.buf[0x17] < '\0') && (local_90.data.ptr != (char *)0x0)) {
    operator_delete__(local_90.data.ptr);
  }
  if ((local_48.buf[0x17] < '\0') && (local_48.data.ptr != (char *)0x0)) {
    operator_delete__(local_48.data.ptr);
  }
  if ((local_78.buf[0x17] < '\0') && (local_78.data.ptr != (char *)0x0)) {
    operator_delete__(local_78.data.ptr);
  }
  if ((local_60.buf[0x17] < '\0') && (local_60.data.ptr != (char *)0x0)) {
    operator_delete__(local_60.data.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }